

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

curl_slist * ADSBExchangeConnection::MakeCurlSList(string *theKey)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar1;
  curl_slist *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  curl_slist *slist;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          curl_slist_append(0,"x-rapidapi-host: adsbexchange-com1.p.rapidapi.com");
  local_10 = __lhs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,in_RDI);
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = (curl_slist *)curl_slist_append(__lhs,uVar1);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator(&local_51);
  return pcVar2;
}

Assistant:

struct curl_slist* ADSBExchangeConnection::MakeCurlSList (const std::string theKey)
{
    struct curl_slist* slist = curl_slist_append(NULL, ADSBEX_RAPIDAPI_HOST);
    return curl_slist_append(slist, (std::string(ADSBEX_RAPIDAPI_KEY)+theKey).c_str());
}